

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O2

uchar getImpulseValue(double p,double pa,double pb,uchar value,int *freq)

{
  if (pa <= p) {
    if ((p < pa) || (pa + pb <= p)) {
      freq = freq + 2;
    }
    else {
      freq = freq + 1;
      value = 0xff;
    }
  }
  else {
    value = '\0';
  }
  *freq = *freq + 1;
  return value;
}

Assistant:

unsigned char getImpulseValue(double p, double pa, double pb, unsigned char value, int *freq) {
    unsigned char newValue = 0;
    if (p < pa) {
        newValue = 0;
        freq[0]++;
    } else if ((p >= pa) && (p < (pa + pb))) {
        newValue = 255;
        freq[1]++;
    } else {
        newValue = value;
        freq[2]++;
    }
    return newValue;
}